

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_err_t * mpc_err_file(char *filename,char *failure)

{
  mpc_err_t *pmVar1;
  size_t sVar2;
  char *pcVar3;
  
  pmVar1 = (mpc_err_t *)malloc(0x48);
  sVar2 = strlen(filename);
  pcVar3 = (char *)malloc(sVar2 + 1);
  pmVar1->filename = pcVar3;
  strcpy(pcVar3,filename);
  (pmVar1->state).pos = 0;
  (pmVar1->state).row = 0;
  *(undefined8 *)((long)&(pmVar1->state).row + 4) = 0;
  *(undefined8 *)((long)&(pmVar1->state).col + 4) = 0;
  pmVar1->expected_num = 0;
  pmVar1->expected = (char **)0x0;
  pcVar3 = (char *)malloc(0x15);
  pmVar1->failure = pcVar3;
  builtin_strncpy(pcVar3,"Unable to open file!",0x15);
  pmVar1->received = ' ';
  return pmVar1;
}

Assistant:

static mpc_err_t *mpc_err_file(const char *filename, const char *failure) {
  mpc_err_t *x;
  x = malloc(sizeof(mpc_err_t));
  x->filename = malloc(strlen(filename) + 1);
  strcpy(x->filename, filename);
  x->state = mpc_state_new();
  x->expected_num = 0;
  x->expected = NULL;
  x->failure = malloc(strlen(failure) + 1);
  strcpy(x->failure, failure);
  x->received = ' ';
  return x;
}